

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerators::MakeCompileSettingsString_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmMakefile *makefile)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  cmMakefile *local_20;
  cmMakefile *makefile_local;
  cmQtAutoGenerators *this_local;
  string *s;
  
  local_21 = 0;
  local_20 = makefile;
  makefile_local = (cmMakefile *)this;
  this_local = (cmQtAutoGenerators *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"AM_MOC_COMPILE_DEFINITIONS",&local_49);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ~~~ ");
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"AM_MOC_INCLUDES",&local_81);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ~~~ ");
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"AM_MOC_OPTIONS",&local_a9);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ~~~ ");
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",&local_d1);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_d0);
  pcVar3 = "FALSE";
  if (bVar2) {
    pcVar3 = "TRUE";
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ~~~ ");
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::MakeCompileSettingsString(cmMakefile* makefile)
{
  std::string s;
  s += makefile->GetSafeDefinition("AM_MOC_COMPILE_DEFINITIONS");
  s += " ~~~ ";
  s += makefile->GetSafeDefinition("AM_MOC_INCLUDES");
  s += " ~~~ ";
  s += makefile->GetSafeDefinition("AM_MOC_OPTIONS");
  s += " ~~~ ";
  s += makefile->IsOn("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE") ? "TRUE"
                                                                     : "FALSE";
  s += " ~~~ ";

  return s;
}